

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumDescriptor * __thiscall
google::protobuf::FileDescriptor::FindEnumTypeByName(FileDescriptor *this,string *key)

{
  bool bVar1;
  Symbol SVar2;
  undefined1 local_30 [8];
  Symbol result;
  string *key_local;
  FileDescriptor *this_local;
  
  result.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)key;
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(this + 0x90),this,key,ENUM);
  result._0_8_ = SVar2.field_1;
  local_30._0_4_ = SVar2.type;
  bVar1 = anon_unknown_1::Symbol::IsNull((Symbol *)local_30);
  if (bVar1) {
    this_local = (FileDescriptor *)0x0;
  }
  else {
    this_local = (FileDescriptor *)result._0_8_;
  }
  return (EnumDescriptor *)this_local;
}

Assistant:

const EnumDescriptor*
FileDescriptor::FindEnumTypeByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM);
  if (!result.IsNull()) {
    return result.enum_descriptor;
  } else {
    return NULL;
  }
}